

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O1

UBool changesWhenCasefolded(BinaryProperty *param_1,UChar32 c,UProperty param_3)

{
  int iVar1;
  int32_t iVar2;
  Normalizer2 *pNVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  bool bVar6;
  UErrorCode errorCode;
  UnicodeString nfd;
  UChar *resultString;
  UErrorCode local_dc;
  UnicodeString local_d8;
  UChar *local_98 [17];
  
  local_d8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b5258;
  local_d8.fUnion.fStackFields.fLengthAndFlags = 2;
  local_dc = U_ZERO_ERROR;
  pNVar3 = icu_63::Normalizer2::getNFCInstance(&local_dc);
  if (local_dc < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = (*(pNVar3->super_UObject)._vptr_UObject[7])(pNVar3,c,&local_d8);
    if ((char)iVar1 == '\0') {
      if (c < 0) goto LAB_002c749d;
    }
    else {
      uVar5 = local_d8.fUnion.fFields.fLength;
      if (-1 < local_d8.fUnion.fStackFields.fLengthAndFlags) {
        uVar5 = (int)local_d8.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if (uVar5 == 1) {
        uVar4 = local_d8.fUnion.fFields.fArray;
        if (((int)local_d8.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
          uVar4 = local_d8.fUnion.fStackFields.fBuffer;
        }
        c = (UChar32)(ushort)*(UChar *)uVar4;
      }
      else if ((2 < (int)uVar5) ||
              (c = icu_63::UnicodeString::char32At(&local_d8,0),
              uVar5 != 2 - (uint)((uint)c < 0x10000))) {
        c = 0xffffffff;
      }
    }
    if (-1 < c) {
      iVar2 = ucase_toFullFolding_63(c,local_98,0);
      bVar6 = -1 < iVar2;
      goto LAB_002c752d;
    }
    if ((local_d8.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
      uVar4 = local_d8.fUnion.fFields.fArray;
      if ((local_d8.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
        uVar4 = local_d8.fUnion.fStackFields.fBuffer;
      }
    }
    else {
      uVar4 = (char16_t *)0x0;
    }
    uVar5 = local_d8.fUnion.fFields.fLength;
    if (-1 < local_d8.fUnion.fStackFields.fLengthAndFlags) {
      uVar5 = (int)local_d8.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    iVar2 = u_strFoldCase_63((UChar *)local_98,0x3e,(UChar *)uVar4,uVar5,0,&local_dc);
    if (local_dc < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((local_d8.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
        if ((local_d8.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
          local_d8.fUnion.fFields.fArray = local_d8.fUnion.fStackFields.fBuffer;
        }
      }
      else {
        local_d8.fUnion.fFields.fArray = (char16_t *)0x0;
      }
      if (-1 < local_d8.fUnion.fStackFields.fLengthAndFlags) {
        local_d8.fUnion.fFields.fLength = (int)local_d8.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      iVar2 = u_strCompare_63(local_d8.fUnion.fFields.fArray,local_d8.fUnion.fFields.fLength,
                              (UChar *)local_98,iVar2,'\0');
      bVar6 = iVar2 != 0;
      goto LAB_002c752d;
    }
  }
LAB_002c749d:
  bVar6 = false;
LAB_002c752d:
  icu_63::UnicodeString::~UnicodeString(&local_d8);
  return bVar6;
}

Assistant:

static UBool changesWhenCasefolded(const BinaryProperty &/*prop*/, UChar32 c, UProperty /*which*/) {
    UnicodeString nfd;
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2 *nfcNorm2=Normalizer2::getNFCInstance(errorCode);
    if(U_FAILURE(errorCode)) {
        return FALSE;
    }
    if(nfcNorm2->getDecomposition(c, nfd)) {
        /* c has a decomposition */
        if(nfd.length()==1) {
            c=nfd[0];  /* single BMP code point */
        } else if(nfd.length()<=U16_MAX_LENGTH &&
                  nfd.length()==U16_LENGTH(c=nfd.char32At(0))
        ) {
            /* single supplementary code point */
        } else {
            c=U_SENTINEL;
        }
    } else if(c<0) {
        return FALSE;  /* protect against bad input */
    }
    if(c>=0) {
        /* single code point */
        const UChar *resultString;
        return (UBool)(ucase_toFullFolding(c, &resultString, U_FOLD_CASE_DEFAULT)>=0);
    } else {
        /* guess some large but stack-friendly capacity */
        UChar dest[2*UCASE_MAX_STRING_LENGTH];
        int32_t destLength;
        destLength=u_strFoldCase(dest, UPRV_LENGTHOF(dest),
                                  nfd.getBuffer(), nfd.length(),
                                  U_FOLD_CASE_DEFAULT, &errorCode);
        return (UBool)(U_SUCCESS(errorCode) &&
                       0!=u_strCompare(nfd.getBuffer(), nfd.length(),
                                       dest, destLength, FALSE));
    }
}